

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::Promise<unsigned_long>_> * __thiscall
kj::anon_unknown_31::PromiseOutputStream::tryPumpFrom
          (Maybe<kj::Promise<unsigned_long>_> *__return_storage_ptr__,PromiseOutputStream *this,
          AsyncInputStream *input,uint64_t amount)

{
  AsyncOutputStream *pAVar1;
  PromiseNode *pPVar2;
  TransformPromiseNodeBase *this_00;
  Own<kj::_::PromiseNode> OStack_78;
  Own<kj::_::PromiseNode> local_68;
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::PromiseNode> local_48;
  Own<kj::_::PromiseNode> local_38;
  
  pAVar1 = (this->stream).ptr.ptr;
  if (pAVar1 == (AsyncOutputStream *)0x0) {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&OStack_78);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x40);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&OStack_78,
               _::
               TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3552:39),_kj::_::PropagateException>
               ::anon_class_24_3_e7c12ea1_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0042b2b8;
    this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)this;
    this_00[1].dependency.disposer = (Disposer *)input;
    this_00[1].dependency.ptr = (PromiseNode *)amount;
    intermediate.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::PromiseOutputStream::tryPumpFrom(kj::AsyncInputStream&,unsigned_long)::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    intermediate.ptr = (PromiseNode *)this_00;
    _::maybeChain<unsigned_long>(&local_48,(Promise<unsigned_long> *)&intermediate);
    pPVar2 = local_48.ptr;
    local_38.disposer = local_48.disposer;
    local_48.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_48);
    local_68.disposer = local_48.disposer;
    local_68.ptr = pPVar2;
    local_38.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_38);
    Own<kj::_::PromiseNode>::dispose(&intermediate);
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.super_PromiseBase.node.disposer = local_48.disposer;
    (__return_storage_ptr__->ptr).field_1.value.super_PromiseBase.node.ptr = pPVar2;
    local_68.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_68);
    Own<kj::_::PromiseNode>::dispose(&OStack_78);
  }
  else {
    (*pAVar1->_vptr_AsyncOutputStream[2])(__return_storage_ptr__,pAVar1,input,amount);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Promise<uint64_t>> tryPumpFrom(
      kj::AsyncInputStream& input, uint64_t amount = kj::maxValue) override {
    KJ_IF_MAYBE(s, stream) {
      return s->get()->tryPumpFrom(input, amount);
    } else {
      return promise.addBranch().then([this,&input,amount]() {
        // Call input.pumpTo() on the resolved stream instead.
        return input.pumpTo(*KJ_ASSERT_NONNULL(stream), amount);
      });
    }
  }